

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_3c73d5::cmFileListGeneratorGlob::GetNextCandidate
          (string *__return_storage_ptr__,cmFileListGeneratorGlob *this,string *parent)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string expr;
  Glob g;
  string local_c0;
  undefined1 local_a0 [88];
  cmAlphaNum local_48;
  
  if ((this->Files).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->Files).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a0._8_8_ = (parent->_M_dataplus)._M_p;
    local_a0._0_8_ = parent->_M_string_length;
    local_48.View_._M_len = (this->Pattern)._M_len;
    local_48.View_._M_str = (this->Pattern)._M_str;
    cmStrCat<>(&local_c0,(cmAlphaNum *)local_a0,&local_48);
    cmsys::Glob::Glob((Glob *)local_a0);
    bVar1 = cmsys::Glob::FindFiles((Glob *)local_a0,&local_c0,(GlobMessages *)0x0);
    if (bVar1) {
      __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_a0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->Files,__x);
      (this->Current)._M_current =
           (this->Files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    cmsys::Glob::~Glob((Glob *)local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  pbVar2 = (this->Current)._M_current;
  do {
    if (pbVar2 == (this->Files).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001c508c:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
    bVar1 = cmsys::SystemTools::FileIsDirectory(pbVar2);
    if (bVar1) {
      pbVar2 = (this->Current)._M_current;
      if (pbVar2 != (this->Files).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        (this->Current)._M_current = pbVar2 + 1;
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
        return __return_storage_ptr__;
      }
      goto LAB_001c508c;
    }
    pbVar2 = (this->Current)._M_current + 1;
    (this->Current)._M_current = pbVar2;
  } while( true );
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (this->Files.empty()) {
      // Glob the set of matching files.
      std::string expr = cmStrCat(parent, this->Pattern);
      cmsys::Glob g;
      if (!g.FindFiles(expr)) {
        return {};
      }
      this->Files = g.GetFiles();
      this->Current = this->Files.cbegin();
    }

    // Skip non-directories
    for (; this->Current != this->Files.cend() &&
         !cmSystemTools::FileIsDirectory(*this->Current);
         ++this->Current) {
    }

    return (this->Current != this->Files.cend()) ? *this->Current++
                                                 : std::string{};
  }